

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
cmCustomCommandGenerator::GetInternalDepfileName
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,string *param_1,
          string *depfile)

{
  uint uVar1;
  string *psVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view input;
  string extension;
  cmCryptoHash hash;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  cmCryptoHash local_b0;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  size_type local_50;
  pointer local_48;
  string *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  cmCryptoHash::cmCryptoHash(&local_b0,AlgoSHA256);
  local_c8 = (char *)0x0;
  local_c0 = 0;
  local_d0 = &local_c0;
  uVar1 = (*this->LG->GlobalGenerator->_vptr_cmGlobalGenerator[0x34])();
  if (uVar1 < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0,0,local_c8,
               (ulong)(&DAT_008517c8 + *(int *)(&DAT_008517c8 + (ulong)(uVar1 & 3) * 4)));
  }
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this->LG);
  input._M_str = (depfile->_M_dataplus)._M_p;
  input._M_len = depfile->_M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&local_a0,&local_b0,input);
  local_80.first._M_str = (psVar2->_M_dataplus)._M_p;
  local_80.first._M_len = psVar2->_M_string_length;
  local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = 0xe;
  local_60 = "/CMakeFiles/d/";
  local_58 = 0;
  local_50 = local_a0._M_string_length;
  local_48 = local_a0._M_dataplus._M_p;
  local_38 = local_c8;
  local_30 = local_d0;
  local_28 = 0;
  views._M_len = 4;
  views._M_array = &local_80;
  local_40 = &local_a0;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  cmCryptoHash::~cmCryptoHash(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetInternalDepfileName(
  const std::string& /*config*/, const std::string& depfile) const
{
  cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
  std::string extension;
  switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
    case cmDepfileFormat::GccDepfile:
    case cmDepfileFormat::MakeDepfile:
      extension = ".d";
      break;
    case cmDepfileFormat::MSBuildAdditionalInputs:
      extension = ".AdditionalInputs";
      break;
  }
  return cmStrCat(this->LG->GetBinaryDirectory(), "/CMakeFiles/d/",
                  hash.HashString(depfile), extension);
}